

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.hxx
# Opt level: O0

void __thiscall cm::String::String(String *this,initializer_list<char> il)

{
  allocator<char> local_59;
  String *local_58;
  iterator pcStack_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  String *local_20;
  String *this_local;
  initializer_list<char> il_local;
  
  pcStack_50 = (iterator)il._M_len;
  local_58 = (String *)il._M_array;
  local_20 = this;
  this_local = local_58;
  il_local._M_array = pcStack_50;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,local_58,pcStack_50,&local_59);
  String<std::__cxx11::string,void>(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_59);
  return;
}

Assistant:

String(std::initializer_list<char> il)
    : String(std::string(il))
  {
  }